

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O3

int Gia_ManLutLevelWithBoxes(Gia_Man_t *p)

{
  Tim_Man_t *p_00;
  Vec_Int_t *pVVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  float *pfVar8;
  Gia_Obj_t *pGVar9;
  int Fill;
  uint Fill_00;
  undefined8 extraout_RDX;
  undefined8 uVar10;
  undefined8 extraout_RDX_00;
  ulong extraout_RDX_01;
  float *pfVar12;
  float *pfVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  int local_9c;
  int local_90;
  int local_8c;
  ulong uVar11;
  
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                  ,0x24a,"int Gia_ManLutLevelWithBoxes(Gia_Man_t *)");
  }
  p_00 = (Tim_Man_t *)p->pManTime;
  Gia_ManCleanLevels(p,p->nObjs);
  if (0 < p->nObjs) {
    pVVar1 = p->vLevels;
    Vec_IntFillExtra(pVVar1,1,Fill);
    if (pVVar1->nSize < 1) {
LAB_00784af1:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    *pVVar1->pArray = 0;
    Gia_ManIncrementTravId(p);
    if (0 < p->nObjs) {
      if (p->nTravIdsAlloc < 1) {
LAB_00784b10:
        __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x23a,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
      }
      *p->pTravIds = p->nTravIds;
      iVar4 = Tim_ManPiNum(p_00);
      if (0 < iVar4) {
        lVar16 = 0;
        uVar10 = extraout_RDX;
        do {
          if (p->vCis->nSize <= lVar16) goto LAB_00784a94;
          iVar4 = p->vCis->pArray[lVar16];
          lVar15 = (long)iVar4;
          if ((lVar15 < 0) || (p->nObjs <= iVar4)) goto LAB_00784ab3;
          pGVar9 = p->pObjs + lVar15;
          pVVar1 = p->vLevels;
          Vec_IntFillExtra(pVVar1,iVar4 + 1,(int)uVar10);
          if (pVVar1->nSize <= iVar4) goto LAB_00784af1;
          pVVar1->pArray[lVar15] = 0;
          pGVar2 = p->pObjs;
          if ((pGVar9 < pGVar2) || (pGVar2 + p->nObjs <= pGVar9)) goto LAB_00784ad2;
          iVar4 = (int)((long)pGVar9 - (long)pGVar2 >> 2) * -0x55555555;
          if (p->nTravIdsAlloc <= iVar4) goto LAB_00784b10;
          p->pTravIds[iVar4] = p->nTravIds;
          lVar16 = lVar16 + 1;
          iVar4 = Tim_ManPiNum(p_00);
          uVar10 = extraout_RDX_00;
        } while (lVar16 < iVar4);
      }
      local_90 = Tim_ManPiNum(p_00);
      iVar4 = Tim_ManBoxNum(p_00);
      if (iVar4 < 1) {
        local_9c = 0;
      }
      else {
        iVar4 = 0;
        local_9c = 0;
        do {
          uVar5 = Tim_ManBoxInputNum(p_00,iVar4);
          uVar6 = Tim_ManBoxOutputNum(p_00,iVar4);
          pfVar8 = Tim_ManBoxDelayTable(p_00,iVar4);
          uVar18 = (ulong)uVar5;
          if (0 < (int)uVar5) {
            lVar16 = (long)local_9c;
            uVar17 = uVar18;
            do {
              if ((local_9c < 0) || (p->vCos->nSize <= lVar16)) goto LAB_00784a94;
              iVar7 = p->vCos->pArray[lVar16];
              if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_00784ab3;
              pGVar9 = p->pObjs + iVar7;
              iVar7 = Gia_ManLutLevelWithBoxes_rec
                                (p,pGVar9 + -(ulong)((uint)*(undefined8 *)pGVar9 & 0x1fffffff));
              if (iVar7 != 0) {
                puts(
                    "Boxes are not in a topological order. Switching to level computation without boxes."
                    );
                iVar4 = Gia_ManLevelNum(p);
                return iVar4;
              }
              Gia_ObjSetCoLevel(p,pGVar9);
              lVar16 = lVar16 + 1;
              uVar17 = uVar17 - 1;
            } while (uVar17 != 0);
          }
          if (0 < (int)uVar6) {
            pfVar12 = pfVar8 + 3;
            uVar17 = 0;
            do {
              if (local_90 < 0) goto LAB_00784a94;
              if ((long)p->vCis->nSize <= (long)((long)local_90 + uVar17)) goto LAB_00784a94;
              iVar7 = p->vCis->pArray[(long)local_90 + uVar17];
              lVar16 = (long)iVar7;
              if ((lVar16 < 0) || (p->nObjs <= iVar7)) goto LAB_00784ab3;
              if (p->nTravIdsAlloc <= iVar7) goto LAB_00784b10;
              pGVar9 = p->pObjs;
              p->pTravIds[lVar16] = p->nTravIds;
              Fill_00 = (uint)pfVar8[1];
              uVar11 = (ulong)Fill_00;
              if (uVar5 != Fill_00) {
                __assert_fail("nBoxInputs == (int)pDelayTable[1]",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                              ,0x272,"int Gia_ManLutLevelWithBoxes(Gia_Man_t *)");
              }
              pGVar2 = pGVar9 + lVar16;
              if ((int)uVar5 < 1) {
                local_8c = 0;
              }
              else {
                local_8c = 0;
                pfVar13 = pfVar12;
                uVar14 = uVar18;
                lVar16 = (long)local_9c;
                do {
                  Fill_00 = (uint)uVar11;
                  if ((local_9c < 0) || (p->vCos->nSize <= lVar16)) goto LAB_00784a94;
                  iVar7 = p->vCos->pArray[lVar16];
                  if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_00784ab3;
                  if (p->pObjs == (Gia_Obj_t *)0x0) {
                    pGVar9 = (Gia_Obj_t *)0x0;
                    goto LAB_00784845;
                  }
                  if ((int)*pfVar13 != -1000000000) {
                    pVVar1 = p->vLevels;
                    Vec_IntFillExtra(pVVar1,iVar7 + 1,Fill_00);
                    if (pVVar1->nSize <= iVar7) goto LAB_00784a94;
                    iVar7 = pVVar1->pArray[iVar7] + 1;
                    uVar11 = extraout_RDX_01;
                    if (local_8c <= iVar7) {
                      local_8c = iVar7;
                    }
                  }
                  Fill_00 = (uint)uVar11;
                  pfVar13 = pfVar13 + 1;
                  lVar16 = lVar16 + 1;
                  uVar14 = uVar14 - 1;
                } while (uVar14 != 0);
                pGVar9 = p->pObjs;
              }
              if (pGVar2 < pGVar9) goto LAB_00784ad2;
LAB_00784845:
              if (pGVar9 + p->nObjs <= pGVar2) goto LAB_00784ad2;
              uVar3 = (int)((long)pGVar2 - (long)pGVar9 >> 2) * -0x55555555;
              pVVar1 = p->vLevels;
              Vec_IntFillExtra(pVVar1,uVar3 + 1,Fill_00);
              if (((int)uVar3 < 0) || (pVVar1->nSize <= (int)uVar3)) goto LAB_00784af1;
              pVVar1->pArray[uVar3 & 0x7fffffff] = local_8c;
              uVar17 = uVar17 + 1;
              pfVar12 = pfVar12 + uVar18;
            } while (uVar17 != uVar6);
          }
          local_90 = local_90 + uVar6;
          local_9c = local_9c + uVar5;
          iVar4 = iVar4 + 1;
          iVar7 = Tim_ManBoxNum(p_00);
        } while (iVar4 < iVar7);
      }
      p->nLevels = 0;
      iVar4 = Tim_ManCoNum(p_00);
      iVar7 = Tim_ManPoNum(p_00);
      uVar5 = iVar4 - iVar7;
      iVar4 = Tim_ManCoNum(p_00);
      if ((int)uVar5 < iVar4) {
        uVar18 = (ulong)uVar5;
LAB_00784953:
        if (((int)uVar5 < 0) || (p->vCos->nSize <= (int)uVar18)) {
LAB_00784a94:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar4 = p->vCos->pArray[uVar18];
        if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
LAB_00784ab3:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar9 = p->pObjs + iVar4;
        Gia_ManLutLevelWithBoxes_rec(p,pGVar9 + -(ulong)((uint)*(undefined8 *)pGVar9 & 0x1fffffff));
        Gia_ObjSetCoLevel(p,pGVar9);
        pGVar2 = p->pObjs;
        if ((pGVar9 < pGVar2) || (pGVar2 + p->nObjs <= pGVar9)) goto LAB_00784ad2;
        iVar4 = p->nLevels;
        uVar6 = (int)((long)pGVar9 - (long)pGVar2 >> 2) * -0x55555555;
        pVVar1 = p->vLevels;
        Vec_IntFillExtra(pVVar1,uVar6 + 1,(int)p);
        if (((int)uVar6 < 0) || (pVVar1->nSize <= (int)uVar6)) goto LAB_00784a94;
        iVar7 = pVVar1->pArray[uVar6 & 0x7fffffff];
        if (pVVar1->pArray[uVar6 & 0x7fffffff] < iVar4) {
          iVar7 = iVar4;
        }
        p->nLevels = iVar7;
        uVar18 = uVar18 + 1;
        iVar4 = Tim_ManCoNum(p_00);
        if ((int)uVar18 < iVar4) goto LAB_00784953;
      }
      iVar4 = Tim_ManPoNum(p_00);
      if (local_90 != p->vCis->nSize) {
        __assert_fail("curCi == Gia_ManCiNum(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                      ,0x288,"int Gia_ManLutLevelWithBoxes(Gia_Man_t *)");
      }
      if (iVar4 + local_9c != p->vCos->nSize) {
        __assert_fail("curCo == Gia_ManCoNum(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                      ,0x289,"int Gia_ManLutLevelWithBoxes(Gia_Man_t *)");
      }
      return p->nLevels;
    }
  }
LAB_00784ad2:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

int Gia_ManLutLevelWithBoxes( Gia_Man_t * p )
{
//    int nAnd2Delay = p->nAnd2Delay ? p->nAnd2Delay : 1;
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    Gia_Obj_t * pObj, * pObjIn;
    int i, k, j, curCi, curCo, LevelMax;
    assert( Gia_ManRegNum(p) == 0 );
    // copy const and real PIs
    Gia_ManCleanLevels( p, Gia_ManObjNum(p) );
    Gia_ObjSetLevel( p, Gia_ManConst0(p), 0 );
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    for ( i = 0; i < Tim_ManPiNum(pManTime); i++ )
    {
        pObj = Gia_ManCi( p, i );
//        Gia_ObjSetLevel( p, pObj, Tim_ManGetCiArrival(pManTime, i) / nAnd2Delay );
        Gia_ObjSetLevel( p, pObj, 0 );
        Gia_ObjSetTravIdCurrent( p, pObj );
    }
    // create logic for each box
    curCi = Tim_ManPiNum(pManTime);
    curCo = 0;
    for ( i = 0; i < Tim_ManBoxNum(pManTime); i++ )
    {
        int nBoxInputs  = Tim_ManBoxInputNum( pManTime, i );
        int nBoxOutputs = Tim_ManBoxOutputNum( pManTime, i );
        float * pDelayTable = Tim_ManBoxDelayTable( pManTime, i );
        // compute level for TFI of box inputs
        for ( k = 0; k < nBoxInputs; k++ )
        {
            pObj = Gia_ManCo( p, curCo + k );
            if ( Gia_ManLutLevelWithBoxes_rec( p, Gia_ObjFanin0(pObj) ) )
            {
                printf( "Boxes are not in a topological order. Switching to level computation without boxes.\n" );
                return Gia_ManLevelNum( p );
            }
            // set box input level
            Gia_ObjSetCoLevel( p, pObj );
        }
        // compute level for box outputs
        for ( k = 0; k < nBoxOutputs; k++ )
        {
            pObj = Gia_ManCi( p, curCi + k );
            Gia_ObjSetTravIdCurrent( p, pObj );
            // evaluate delay of this output
            LevelMax = 0;
            assert( nBoxInputs == (int)pDelayTable[1] );
            for ( j = 0; j < nBoxInputs && (pObjIn = Gia_ManCo(p, curCo + j)); j++ )
                if ( (int)pDelayTable[3+k*nBoxInputs+j] != -ABC_INFINITY )
//                    LevelMax = Abc_MaxInt( LevelMax, Gia_ObjLevel(p, pObjIn) + ((int)pDelayTable[3+k*nBoxInputs+j] / nAnd2Delay) );
                    LevelMax = Abc_MaxInt( LevelMax, Gia_ObjLevel(p, pObjIn) + 1 );
            // set box output level
            Gia_ObjSetLevel( p, pObj, LevelMax );
        }
        curCo += nBoxInputs;
        curCi += nBoxOutputs;
    }
    // add remaining nodes
    p->nLevels = 0;
    for ( i = Tim_ManCoNum(pManTime) - Tim_ManPoNum(pManTime); i < Tim_ManCoNum(pManTime); i++ )
    {
        pObj = Gia_ManCo( p, i );
        Gia_ManLutLevelWithBoxes_rec( p, Gia_ObjFanin0(pObj) );
        Gia_ObjSetCoLevel( p, pObj );
        p->nLevels = Abc_MaxInt( p->nLevels, Gia_ObjLevel(p, pObj) );
    }
    curCo += Tim_ManPoNum(pManTime);
    // verify counts
    assert( curCi == Gia_ManCiNum(p) );
    assert( curCo == Gia_ManCoNum(p) );
//    printf( "Max level is %d.\n", p->nLevels );
    return p->nLevels;
}